

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

void __thiscall
cmComputeLinkInformation::AddUserItem
          (cmComputeLinkInformation *this,LinkEntry *entry,bool pathNotKnown)

{
  string_view sVar1;
  bool bVar2;
  char *pcVar3;
  FeatureDescriptor *this_00;
  ItemIsPath local_1f4;
  cmListFileBacktrace local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_1c0;
  ItemIsPath local_18c;
  cmListFileBacktrace local_188;
  string local_178;
  string local_158;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_138;
  FeatureDescriptor *local_108;
  FeatureDescriptor *feature;
  string out;
  string local_c0;
  string local_a0;
  undefined1 local_70 [8];
  string lib;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *item;
  bool pathNotKnown_local;
  LinkEntry *entry_local;
  cmComputeLinkInformation *this_local;
  
  pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)entry);
  if (((*pcVar3 != '-') &&
      (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)entry), *pcVar3 != '$')) &&
     (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)entry), *pcVar3 != '`')) {
    std::__cxx11::string::string((string *)local_70);
    bVar2 = cmsys::RegularExpression::find(&this->ExtractSharedLibraryName,(string *)entry);
    if (bVar2) {
      SetCurrentLinkType(this,LinkShared);
      cmsys::RegularExpression::match_abi_cxx11_(&local_a0,&this->ExtractSharedLibraryName,2);
      std::__cxx11::string::operator=((string *)local_70,(string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
    }
    else {
      bVar2 = cmsys::RegularExpression::find(&this->ExtractStaticLibraryName,(string *)entry);
      if (bVar2) {
        SetCurrentLinkType(this,LinkStatic);
        cmsys::RegularExpression::match_abi_cxx11_(&local_c0,&this->ExtractStaticLibraryName,2);
        std::__cxx11::string::operator=((string *)local_70,(string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_c0);
      }
      else {
        bVar2 = cmsys::RegularExpression::find(&this->ExtractAnyLibraryName,(string *)entry);
        if (bVar2) {
          SetCurrentLinkType(this,this->StartLinkType);
          cmsys::RegularExpression::match_abi_cxx11_
                    ((string *)((long)&out.field_2 + 8),&this->ExtractAnyLibraryName,2);
          std::__cxx11::string::operator=
                    ((string *)local_70,(string *)(out.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(out.field_2._M_local_buf + 8));
        }
        else {
          if (pathNotKnown) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&this->OldUserFlagItems,(value_type *)entry);
          }
          SetCurrentLinkType(this,this->StartLinkType);
          std::__cxx11::string::operator=((string *)local_70,(string *)entry);
        }
      }
    }
    cmStrCat<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
              ((string *)&feature,&this->LibLinkFlag,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
               &this->LibLinkSuffix);
    bVar2 = std::operator!=(&entry->Feature,(anonymous_namespace)::DEFAULT_abi_cxx11_);
    if (bVar2) {
      this_00 = GetLibraryFeature(this,&entry->Feature);
      local_108 = this_00;
      cmStrCat<std::__cxx11::string&,std::__cxx11::string&>
                (&local_178,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                 &this->LibLinkSuffix);
      FeatureDescriptor::GetDecoratedItem
                (&local_158,this_00,&local_178,(string *)entry,(string *)&feature,No);
      cmListFileBacktrace::cmListFileBacktrace(&local_188,&(entry->Item).Backtrace);
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                (&local_138,&local_158,&local_188);
      local_18c = No;
      std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
      emplace_back<BT<std::__cxx11::string>,cmComputeLinkInformation::ItemIsPath>
                ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                  *)this,&local_138,&local_18c);
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                (&local_138);
      cmListFileBacktrace::~cmListFileBacktrace(&local_188);
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)&local_178);
    }
    else {
      std::__cxx11::string::string((string *)&local_1e0,(string *)&feature);
      cmListFileBacktrace::cmListFileBacktrace(&local_1f0,&(entry->Item).Backtrace);
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                (&local_1c0,&local_1e0,&local_1f0);
      local_1f4 = No;
      std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
      emplace_back<BT<std::__cxx11::string>,cmComputeLinkInformation::ItemIsPath>
                ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                  *)this,&local_1c0,&local_1f4);
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                (&local_1c0);
      cmListFileBacktrace::~cmListFileBacktrace(&local_1f0);
      std::__cxx11::string::~string((string *)&local_1e0);
    }
    std::__cxx11::string::~string((string *)&feature);
    std::__cxx11::string::~string((string *)local_70);
    return;
  }
  sVar1 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)entry);
  bVar2 = cmHasLiteralPrefix<3ul>(sVar1,(char (*) [3])0x115a868);
  if (!bVar2) {
    sVar1 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)entry);
    bVar2 = cmHasLiteralPrefix<7ul>(sVar1,(char (*) [7])"-Wl,-l");
    if (!bVar2) goto LAB_008a4d6b;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->OldUserFlagItems,(value_type *)entry);
LAB_008a4d6b:
  SetCurrentLinkType(this,this->StartLinkType);
  lib.field_2._12_4_ = 0;
  std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
  emplace_back<BT<std::__cxx11::string>const&,cmComputeLinkInformation::ItemIsPath>
            ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
              *)this,&entry->Item,(ItemIsPath *)(lib.field_2._M_local_buf + 0xc));
  return;
}

Assistant:

void cmComputeLinkInformation::AddUserItem(LinkEntry const& entry,
                                           bool pathNotKnown)
{
  // This is called to handle a link item that does not match a CMake
  // target and is not a full path.  We check here if it looks like a
  // library file name to automatically request the proper link type
  // from the linker.  For example:
  //
  //   foo       ==>  -lfoo
  //   libfoo.a  ==>  -Wl,-Bstatic -lfoo

  BT<std::string> const& item = entry.Item;

  if (item.Value[0] == '-' || item.Value[0] == '$' || item.Value[0] == '`') {
    // Pass flags through untouched.
    // if this is a -l option then we might need to warn about
    // CMP0003 so put it in OldUserFlagItems, if it is not a -l
    // or -Wl,-l (-framework -pthread), then allow it without a
    // CMP0003 as -L will not affect those other linker flags
    if (cmHasLiteralPrefix(item.Value, "-l") ||
        cmHasLiteralPrefix(item.Value, "-Wl,-l")) {
      // This is a linker option provided by the user.
      this->OldUserFlagItems.push_back(item.Value);
    }

    // Restore the target link type since this item does not specify
    // one.
    this->SetCurrentLinkType(this->StartLinkType);

    // Use the item verbatim.
    this->Items.emplace_back(item, ItemIsPath::No);
    return;
  }

  // Parse out the prefix, base, and suffix components of the
  // library name.  If the name matches that of a shared or static
  // library then set the link type accordingly.
  //
  // Search for shared library names first because some platforms
  // have shared libraries with names that match the static library
  // pattern.  For example cygwin and msys use the convention
  // libfoo.dll.a for import libraries and libfoo.a for static
  // libraries.  On AIX a library with the name libfoo.a can be
  // shared!
  std::string lib;
  if (this->ExtractSharedLibraryName.find(item.Value)) {
// This matches a shared library file name.
#ifdef CM_COMPUTE_LINK_INFO_DEBUG
    fprintf(stderr, "shared regex matched [%s] [%s] [%s]\n",
            this->ExtractSharedLibraryName.match(1).c_str(),
            this->ExtractSharedLibraryName.match(2).c_str(),
            this->ExtractSharedLibraryName.match(3).c_str());
#endif
    // Set the link type to shared.
    this->SetCurrentLinkType(LinkShared);

    // Use just the library name so the linker will search.
    lib = this->ExtractSharedLibraryName.match(2);
  } else if (this->ExtractStaticLibraryName.find(item.Value)) {
// This matches a static library file name.
#ifdef CM_COMPUTE_LINK_INFO_DEBUG
    fprintf(stderr, "static regex matched [%s] [%s] [%s]\n",
            this->ExtractStaticLibraryName.match(1).c_str(),
            this->ExtractStaticLibraryName.match(2).c_str(),
            this->ExtractStaticLibraryName.match(3).c_str());
#endif
    // Set the link type to static.
    this->SetCurrentLinkType(LinkStatic);

    // Use just the library name so the linker will search.
    lib = this->ExtractStaticLibraryName.match(2);
  } else if (this->ExtractAnyLibraryName.find(item.Value)) {
// This matches a library file name.
#ifdef CM_COMPUTE_LINK_INFO_DEBUG
    fprintf(stderr, "any regex matched [%s] [%s] [%s]\n",
            this->ExtractAnyLibraryName.match(1).c_str(),
            this->ExtractAnyLibraryName.match(2).c_str(),
            this->ExtractAnyLibraryName.match(3).c_str());
#endif
    // Restore the target link type since this item does not specify
    // one.
    this->SetCurrentLinkType(this->StartLinkType);

    // Use just the library name so the linker will search.
    lib = this->ExtractAnyLibraryName.match(2);
  } else {
    // This is a name specified by the user.
    if (pathNotKnown) {
      this->OldUserFlagItems.push_back(item.Value);
    }

    // We must ask the linker to search for a library with this name.
    // Restore the target link type since this item does not specify
    // one.
    this->SetCurrentLinkType(this->StartLinkType);
    lib = item.Value;
  }

  // Create an option to ask the linker to search for the library.
  auto out = cmStrCat(this->LibLinkFlag, lib, this->LibLinkSuffix);

  if (entry.Feature != DEFAULT) {
    auto const& feature = this->GetLibraryFeature(entry.Feature);
    this->Items.emplace_back(
      BT<std::string>(
        feature.GetDecoratedItem(cmStrCat(lib, this->LibLinkSuffix),
                                 item.Value, out, ItemIsPath::No),
        item.Backtrace),
      ItemIsPath::No);
  } else {
    this->Items.emplace_back(BT<std::string>(out, item.Backtrace),
                             ItemIsPath::No);
  }

  // Here we could try to find the library the linker will find and
  // add a runtime information entry for it.  It would probably not be
  // reliable and we want to encourage use of full paths for library
  // specification.
}